

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall Logger::createLogFile(Logger *this)

{
  ulong uVar1;
  ostream *poVar2;
  long in_RDI;
  Logger *in_stack_00000098;
  string local_28 [40];
  
  getCurrentLogFileName_abi_cxx11_(in_stack_00000098);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x48),local_28);
  std::__cxx11::string::~string(local_28);
  std::ofstream::open((string *)(in_RDI + 0xa8),(int)in_RDI + 0x48);
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to create log file: ");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 0x48));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

inline void createLogFile()  // 创建日志文件
    {
#if defined(_WIN32) || defined(_WIN64)
        logFileName = getCurrentLogFileName();
        // 创建并打开日志文件
        logFileHandle = CreateFile(logFileName.c_str(), GENERIC_WRITE, FILE_SHARE_READ, NULL, CREATE_ALWAYS, FILE_ATTRIBUTE_NORMAL, NULL);
        if (logFileHandle == INVALID_HANDLE_VALUE) {
            std::cerr << "Failed to create log file: " << logFileName << std::endl;
            return;
        }
        // 设置文件指针到文件末尾
        SetFilePointer(logFileHandle, 0, NULL, FILE_END);
#else
        logFileName = getCurrentLogFileName();
        // 创建并打开日志文件
        logfp.open(logFileName, std::ios::app);
        if (!logfp.is_open()) {
            std::cerr << "Failed to create log file: " << logFileName << std::endl;
        }
#endif
    }